

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hdwallet.cpp
# Opt level: O0

void __thiscall HDWallet_GeneratePrivkeyTest_Test::TestBody(HDWallet_GeneratePrivkeyTest_Test *this)

{
  allocator<unsigned_int> *paVar1;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  bool bVar2;
  char *pcVar3;
  char *rhs;
  AssertHelper local_1098;
  Message local_1090;
  string local_1088;
  undefined1 local_1068 [8];
  AssertionResult gtest_ar_8;
  Message local_1050;
  KeyData local_1048;
  undefined1 local_ec0 [8];
  KeyData keypath2;
  uint local_d30 [2];
  iterator local_d28;
  size_type local_d20;
  undefined1 local_d18 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> path2;
  Message local_cf8;
  string local_cf0;
  undefined1 local_cd0 [8];
  AssertionResult gtest_ar_7;
  Message local_cb8;
  string local_cb0;
  undefined1 local_c90 [8];
  AssertionResult gtest_ar_6;
  Message local_c78;
  allocator local_c69;
  string local_c68;
  KeyData local_c48;
  undefined1 local_ac0 [8];
  KeyData keypath1;
  Message local_930;
  string local_928;
  undefined1 local_908 [8];
  AssertionResult gtest_ar_5;
  Message local_8f0;
  allocator local_8e1;
  string local_8e0;
  ExtPrivkey local_8c0;
  undefined1 local_830 [8];
  ExtPrivkey privkeyh;
  Message local_798;
  string local_790;
  string local_770;
  undefined1 local_750 [8];
  AssertionResult gtest_ar_4;
  Message local_738;
  ExtPrivkey local_730;
  undefined1 local_6a0 [8];
  ExtPrivkey privkey2;
  Message local_608;
  string local_600;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar_3;
  Message local_5c8;
  ExtPrivkey local_5c0;
  undefined1 local_530 [8];
  ExtPrivkey privkey1;
  Message local_498;
  string local_490;
  undefined1 local_470 [8];
  AssertionResult gtest_ar_2;
  Message local_458;
  ExtPrivkey local_450;
  undefined1 local_3c0 [8];
  ExtPrivkey privkey0;
  uint local_328 [2];
  iterator local_320;
  size_type local_318;
  undefined1 local_310 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  Message local_2f0;
  string local_2e8;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_1;
  Message local_2b0;
  ExtPrivkey local_2a8;
  AssertHelper local_218;
  Message local_210;
  string local_208;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar;
  Message local_1d0;
  ExtPrivkey local_1c8;
  undefined1 local_138 [8];
  ExtPrivkey privkey;
  Message local_a0 [2];
  HDWallet local_90;
  undefined1 local_78 [8];
  HDWallet wallet;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  ByteData seed;
  HDWallet_GeneratePrivkeyTest_Test *this_local;
  
  seed.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,
             "c55257c360c07c72029aebc1b53c05ed0362ada38ead3e3e9efa3708e53495531f09a6987599d18264c1e1c92f2cf141630c7a3c4ab7c81b2f001698e7463b04"
             ,&local_49);
  cfd::core::ByteData::ByteData((ByteData *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cfd::core::HDWallet::HDWallet((HDWallet *)local_78);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::HDWallet::HDWallet(&local_90,(ByteData *)local_28);
      cfd::core::HDWallet::operator=((HDWallet *)local_78,&local_90);
      cfd::core::HDWallet::~HDWallet(&local_90);
    }
  }
  else {
    testing::Message::Message(local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               ((long)&privkey.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x131,
               "Expected: (wallet = HDWallet(seed)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               ((long)&privkey.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10),local_a0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               ((long)&privkey.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10));
    testing::Message::~Message(local_a0);
  }
  cfd::core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_138);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::HDWallet::GeneratePrivkey(&local_1c8,(HDWallet *)local_78,kMainnet,kNormal);
      cfd::core::ExtPrivkey::operator=((ExtPrivkey *)local_138,&local_1c8);
      cfd::core::ExtPrivkey::~ExtPrivkey(&local_1c8);
    }
  }
  else {
    testing::Message::Message(&local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x134,
               "Expected: (privkey = wallet.GeneratePrivkey(NetType::kMainnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_1d0);
  }
  cfd::core::Extkey::ToString_abi_cxx11_(&local_208,(Extkey *)local_138);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1e8,"privkey.ToString().c_str()",
             "\"xprv9s21ZrQH143K3h3fDYiay8mocZ3afhfULfb5GX8kCBdno77K4HiA15Tg23wpbeF1pLfs1c5SPmYHrEpTuuRhxMwvKDwqdKiGJS9XFKzUsAF\""
             ,pcVar3,
             "xprv9s21ZrQH143K3h3fDYiay8mocZ3afhfULfb5GX8kCBdno77K4HiA15Tg23wpbeF1pLfs1c5SPmYHrEpTuuRhxMwvKDwqdKiGJS9XFKzUsAF"
            );
  std::__cxx11::string::~string((string *)&local_208);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar2) {
    testing::Message::Message(&local_210);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x135,pcVar3);
    testing::internal::AssertHelper::operator=(&local_218,&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::HDWallet::GeneratePrivkey(&local_2a8,(HDWallet *)local_78,kTestnet,kNormal);
      cfd::core::ExtPrivkey::operator=((ExtPrivkey *)local_138,&local_2a8);
      cfd::core::ExtPrivkey::~ExtPrivkey(&local_2a8);
    }
  }
  else {
    testing::Message::Message(&local_2b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x137,
               "Expected: (privkey = wallet.GeneratePrivkey(NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_2b0);
  }
  cfd::core::Extkey::ToString_abi_cxx11_(&local_2e8,(Extkey *)local_138);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2c8,"privkey.ToString().c_str()",
             "\"tprv8ZgxMBicQKsPeWHBt7a68nPnvgTnuDhUgDWC8wZCgA8GahrQ3f3uWpq7wE7Uc1dLBnCe1hhCZ886K6ND37memRDWqsA9HgSKDXtwh2Qxo6J\""
             ,pcVar3,
             "tprv8ZgxMBicQKsPeWHBt7a68nPnvgTnuDhUgDWC8wZCgA8GahrQ3f3uWpq7wE7Uc1dLBnCe1hhCZ886K6ND37memRDWqsA9HgSKDXtwh2Qxo6J"
            );
  std::__cxx11::string::~string((string *)&local_2e8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar2) {
    testing::Message::Message(&local_2f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x138,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  local_328[0] = 0;
  local_328[1] = 0x2c;
  local_320 = local_328;
  local_318 = 2;
  paVar1 = (allocator<unsigned_int> *)
           ((long)&privkey0.super_Extkey.tweak_sum_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data + 0x17);
  std::allocator<unsigned_int>::allocator(paVar1);
  __l_00._M_len = local_318;
  __l_00._M_array = local_320;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_310,__l_00,paVar1);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&privkey0.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x17));
  cfd::core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_3c0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::HDWallet::GeneratePrivkey
                (&local_450,(HDWallet *)local_78,kMainnet,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_310,kNormal);
      cfd::core::ExtPrivkey::operator=((ExtPrivkey *)local_3c0,&local_450);
      cfd::core::ExtPrivkey::~ExtPrivkey(&local_450);
    }
  }
  else {
    testing::Message::Message(&local_458);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x13c,
               "Expected: (privkey0 = wallet.GeneratePrivkey(NetType::kMainnet, path)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_458);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_458);
  }
  cfd::core::Extkey::ToString_abi_cxx11_(&local_490,(Extkey *)local_3c0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_470,"privkey0.ToString().c_str()",
             "\"xprv9wiYQ21HNxnQ8FxBjbYjJy5ckuEZ6CAFsKdHEnfkRcw5pZbXAFSturoZugNE6ZpVSu6kdrYw752chFPAbPMXZ62ZLfYwLMHdzMVXqwnfRFn\""
             ,pcVar3,
             "xprv9wiYQ21HNxnQ8FxBjbYjJy5ckuEZ6CAFsKdHEnfkRcw5pZbXAFSturoZugNE6ZpVSu6kdrYw752chFPAbPMXZ62ZLfYwLMHdzMVXqwnfRFn"
            );
  std::__cxx11::string::~string((string *)&local_490);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
  if (!bVar2) {
    testing::Message::Message(&local_498);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_470);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               ((long)&privkey1.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x13d,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               ((long)&privkey1.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10),&local_498);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               ((long)&privkey1.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10));
    testing::Message::~Message(&local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
  cfd::core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_530);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::HDWallet::GeneratePrivkey(&local_5c0,(HDWallet *)local_78,kMainnet,0,kNormal);
      cfd::core::ExtPrivkey::operator=((ExtPrivkey *)local_530,&local_5c0);
      cfd::core::ExtPrivkey::~ExtPrivkey(&local_5c0);
    }
  }
  else {
    testing::Message::Message(&local_5c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x140,
               "Expected: (privkey1 = wallet.GeneratePrivkey(NetType::kMainnet, 0)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_5c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_5c8);
  }
  cfd::core::Extkey::ToString_abi_cxx11_(&local_600,(Extkey *)local_530);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_5e0,"privkey1.ToString().c_str()",
             "\"xprv9vEG8CuCbvqnJXhr1ZTHZYJcYqGMZ8dkphAUT2CDZsfqewNpq42oSiFgBXXYwDWAHXVbHew4uBfiHNAahRGJ8kUWwqwTGSXUb4wrbWz9eqo\""
             ,pcVar3,
             "xprv9vEG8CuCbvqnJXhr1ZTHZYJcYqGMZ8dkphAUT2CDZsfqewNpq42oSiFgBXXYwDWAHXVbHew4uBfiHNAahRGJ8kUWwqwTGSXUb4wrbWz9eqo"
            );
  std::__cxx11::string::~string((string *)&local_600);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e0);
  if (!bVar2) {
    testing::Message::Message(&local_608);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               ((long)&privkey2.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x141,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               ((long)&privkey2.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10),&local_608);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               ((long)&privkey2.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10));
    testing::Message::~Message(&local_608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e0);
  cfd::core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_6a0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ExtPrivkey::DerivePrivkey(&local_730,(ExtPrivkey *)local_530,0x2c);
      cfd::core::ExtPrivkey::operator=((ExtPrivkey *)local_6a0,&local_730);
      cfd::core::ExtPrivkey::~ExtPrivkey(&local_730);
    }
  }
  else {
    testing::Message::Message(&local_738);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x143,
               "Expected: (privkey2 = privkey1.DerivePrivkey(44)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_738);
  }
  cfd::core::Extkey::ToString_abi_cxx11_(&local_770,(Extkey *)local_6a0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::Extkey::ToString_abi_cxx11_(&local_790,(Extkey *)local_3c0);
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_750,"privkey2.ToString().c_str()","privkey0.ToString().c_str()",
             pcVar3,rhs);
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::~string((string *)&local_770);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_750);
  if (!bVar2) {
    testing::Message::Message(&local_798);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_750);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               ((long)&privkeyh.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x144,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               ((long)&privkeyh.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10),&local_798);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               ((long)&privkeyh.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10));
    testing::Message::~Message(&local_798);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_750);
  cfd::core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_830);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_8e0,"m/0h/44h",&local_8e1);
      cfd::core::HDWallet::GeneratePrivkey
                (&local_8c0,(HDWallet *)local_78,kMainnet,&local_8e0,kNormal);
      cfd::core::ExtPrivkey::operator=((ExtPrivkey *)local_830,&local_8c0);
      cfd::core::ExtPrivkey::~ExtPrivkey(&local_8c0);
      std::__cxx11::string::~string((string *)&local_8e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_8e1);
    }
  }
  else {
    testing::Message::Message(&local_8f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x147,
               "Expected: (privkeyh = wallet.GeneratePrivkey(NetType::kMainnet, \"m/0h/44h\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_8f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_8f0);
  }
  cfd::core::Extkey::ToString_abi_cxx11_(&local_928,(Extkey *)local_830);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_908,"privkeyh.ToString().c_str()",
             "\"xprv9xcgxExFiq8qWLdxFHXpEZF8VH7Qr9YDZb8c7vMsqygWk2YGTBgSnDtm1LESskfAJqGMWkWWGagNCSbHdVgA8EFxSbfAQTKSD1z4iJ8qHtq\""
             ,pcVar3,
             "xprv9xcgxExFiq8qWLdxFHXpEZF8VH7Qr9YDZb8c7vMsqygWk2YGTBgSnDtm1LESskfAJqGMWkWWGagNCSbHdVgA8EFxSbfAQTKSD1z4iJ8qHtq"
            );
  std::__cxx11::string::~string((string *)&local_928);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_908);
  if (!bVar2) {
    testing::Message::Message(&local_930);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_908);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &keypath1.fingerprint_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x148,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &keypath1.fingerprint_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_930);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &keypath1.fingerprint_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_930);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_908);
  cfd::core::KeyData::KeyData((KeyData *)local_ac0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c68,"m/0h/44h",&local_c69);
      cfd::core::HDWallet::GeneratePrivkeyData
                (&local_c48,(HDWallet *)local_78,kMainnet,&local_c68,kNormal);
      cfd::core::KeyData::operator=((KeyData *)local_ac0,&local_c48);
      cfd::core::KeyData::~KeyData(&local_c48);
      std::__cxx11::string::~string((string *)&local_c68);
      std::allocator<char>::~allocator((allocator<char> *)&local_c69);
    }
  }
  else {
    testing::Message::Message(&local_c78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x14b,
               "Expected: (keypath1 = wallet.GeneratePrivkeyData(NetType::kMainnet, \"m/0h/44h\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_c78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_c78);
  }
  cfd::core::KeyData::ToString_abi_cxx11_(&local_cb0,(KeyData *)local_ac0,true,kApostrophe,false);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_c90,"keypath1.ToString().c_str()",
             "\"[b4e3f5ed/0\'/44\']035d3d3ee3ce7044686e0eb4697d92478658ac9f854c3c2bccd7a5a8aa74d3fc7a\""
             ,pcVar3,
             "[b4e3f5ed/0\'/44\']035d3d3ee3ce7044686e0eb4697d92478658ac9f854c3c2bccd7a5a8aa74d3fc7a"
            );
  std::__cxx11::string::~string((string *)&local_cb0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c90);
  if (!bVar2) {
    testing::Message::Message(&local_cb8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x14c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_cb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_cb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c90);
  cfd::core::KeyData::ToString_abi_cxx11_(&local_cf0,(KeyData *)local_ac0,false,kApostrophe,false);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_cd0,"keypath1.ToString(false).c_str()",
             "\"[b4e3f5ed/0\'/44\']xprv9xcgxExFiq8qWLdxFHXpEZF8VH7Qr9YDZb8c7vMsqygWk2YGTBgSnDtm1LESskfAJqGMWkWWGagNCSbHdVgA8EFxSbfAQTKSD1z4iJ8qHtq\""
             ,pcVar3,
             "[b4e3f5ed/0\'/44\']xprv9xcgxExFiq8qWLdxFHXpEZF8VH7Qr9YDZb8c7vMsqygWk2YGTBgSnDtm1LESskfAJqGMWkWWGagNCSbHdVgA8EFxSbfAQTKSD1z4iJ8qHtq"
            );
  std::__cxx11::string::~string((string *)&local_cf0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cd0);
  if (!bVar2) {
    testing::Message::Message(&local_cf8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_cd0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &path2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x14d,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &path2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_cf8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &path2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_cf8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cd0);
  local_d30[0] = 0x80000000;
  local_d30[1] = 0x8000002c;
  local_d28 = local_d30;
  local_d20 = 2;
  paVar1 = (allocator<unsigned_int> *)
           ((long)&keypath2.fingerprint_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_int>::allocator(paVar1);
  __l._M_len = local_d20;
  __l._M_array = local_d28;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d18,__l,paVar1);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&keypath2.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::KeyData::KeyData((KeyData *)local_ec0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::HDWallet::GeneratePrivkeyData
                (&local_1048,(HDWallet *)local_78,kMainnet,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d18,kNormal);
      cfd::core::KeyData::operator=((KeyData *)local_ec0,&local_1048);
      cfd::core::KeyData::~KeyData(&local_1048);
    }
  }
  else {
    testing::Message::Message(&local_1050);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x151,
               "Expected: (keypath2 = wallet.GeneratePrivkeyData(NetType::kMainnet, path2)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_1050);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_1050);
  }
  cfd::core::KeyData::ToString_abi_cxx11_(&local_1088,(KeyData *)local_ec0,false,kApostrophe,false);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1068,"keypath2.ToString(false).c_str()",
             "\"[b4e3f5ed/0\'/44\']xprv9xcgxExFiq8qWLdxFHXpEZF8VH7Qr9YDZb8c7vMsqygWk2YGTBgSnDtm1LESskfAJqGMWkWWGagNCSbHdVgA8EFxSbfAQTKSD1z4iJ8qHtq\""
             ,pcVar3,
             "[b4e3f5ed/0\'/44\']xprv9xcgxExFiq8qWLdxFHXpEZF8VH7Qr9YDZb8c7vMsqygWk2YGTBgSnDtm1LESskfAJqGMWkWWGagNCSbHdVgA8EFxSbfAQTKSD1z4iJ8qHtq"
            );
  std::__cxx11::string::~string((string *)&local_1088);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1068);
  if (!bVar2) {
    testing::Message::Message(&local_1090);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1068);
    testing::internal::AssertHelper::AssertHelper
              (&local_1098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x152,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1098,&local_1090);
    testing::internal::AssertHelper::~AssertHelper(&local_1098);
    testing::Message::~Message(&local_1090);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1068);
  cfd::core::KeyData::~KeyData((KeyData *)local_ec0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d18);
  cfd::core::KeyData::~KeyData((KeyData *)local_ac0);
  cfd::core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)local_830);
  cfd::core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)local_6a0);
  cfd::core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)local_530);
  cfd::core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)local_3c0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_310);
  cfd::core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)local_138);
  cfd::core::HDWallet::~HDWallet((HDWallet *)local_78);
  cfd::core::ByteData::~ByteData((ByteData *)local_28);
  return;
}

Assistant:

TEST(HDWallet, GeneratePrivkeyTest) {
  ByteData seed("c55257c360c07c72029aebc1b53c05ed0362ada38ead3e3e9efa3708e53495531f09a6987599d18264c1e1c92f2cf141630c7a3c4ab7c81b2f001698e7463b04");

  HDWallet wallet;
  EXPECT_NO_THROW((wallet = HDWallet(seed)));

  ExtPrivkey privkey;
  EXPECT_NO_THROW((privkey = wallet.GeneratePrivkey(NetType::kMainnet)));
  EXPECT_STREQ(privkey.ToString().c_str(), "xprv9s21ZrQH143K3h3fDYiay8mocZ3afhfULfb5GX8kCBdno77K4HiA15Tg23wpbeF1pLfs1c5SPmYHrEpTuuRhxMwvKDwqdKiGJS9XFKzUsAF");

  EXPECT_NO_THROW((privkey = wallet.GeneratePrivkey(NetType::kTestnet)));
  EXPECT_STREQ(privkey.ToString().c_str(), "tprv8ZgxMBicQKsPeWHBt7a68nPnvgTnuDhUgDWC8wZCgA8GahrQ3f3uWpq7wE7Uc1dLBnCe1hhCZ886K6ND37memRDWqsA9HgSKDXtwh2Qxo6J");

  std::vector<uint32_t> path = {0, 44};
  ExtPrivkey privkey0;
  EXPECT_NO_THROW((privkey0 = wallet.GeneratePrivkey(NetType::kMainnet, path)));
  EXPECT_STREQ(privkey0.ToString().c_str(), "xprv9wiYQ21HNxnQ8FxBjbYjJy5ckuEZ6CAFsKdHEnfkRcw5pZbXAFSturoZugNE6ZpVSu6kdrYw752chFPAbPMXZ62ZLfYwLMHdzMVXqwnfRFn");

  ExtPrivkey privkey1;
  EXPECT_NO_THROW((privkey1 = wallet.GeneratePrivkey(NetType::kMainnet, 0)));
  EXPECT_STREQ(privkey1.ToString().c_str(), "xprv9vEG8CuCbvqnJXhr1ZTHZYJcYqGMZ8dkphAUT2CDZsfqewNpq42oSiFgBXXYwDWAHXVbHew4uBfiHNAahRGJ8kUWwqwTGSXUb4wrbWz9eqo");
  ExtPrivkey privkey2;
  EXPECT_NO_THROW((privkey2 = privkey1.DerivePrivkey(44)));
  EXPECT_STREQ(privkey2.ToString().c_str(), privkey0.ToString().c_str());

  ExtPrivkey privkeyh;
  EXPECT_NO_THROW((privkeyh = wallet.GeneratePrivkey(NetType::kMainnet, "m/0h/44h")));
  EXPECT_STREQ(privkeyh.ToString().c_str(), "xprv9xcgxExFiq8qWLdxFHXpEZF8VH7Qr9YDZb8c7vMsqygWk2YGTBgSnDtm1LESskfAJqGMWkWWGagNCSbHdVgA8EFxSbfAQTKSD1z4iJ8qHtq");

  KeyData keypath1;
  EXPECT_NO_THROW((keypath1 = wallet.GeneratePrivkeyData(NetType::kMainnet, "m/0h/44h")));
  EXPECT_STREQ(keypath1.ToString().c_str(), "[b4e3f5ed/0'/44']035d3d3ee3ce7044686e0eb4697d92478658ac9f854c3c2bccd7a5a8aa74d3fc7a");
  EXPECT_STREQ(keypath1.ToString(false).c_str(), "[b4e3f5ed/0'/44']xprv9xcgxExFiq8qWLdxFHXpEZF8VH7Qr9YDZb8c7vMsqygWk2YGTBgSnDtm1LESskfAJqGMWkWWGagNCSbHdVgA8EFxSbfAQTKSD1z4iJ8qHtq");
  
  std::vector<uint32_t> path2 = {0x80000000, 0x80000000 + 44};
  KeyData keypath2;
  EXPECT_NO_THROW((keypath2 = wallet.GeneratePrivkeyData(NetType::kMainnet, path2)));
  EXPECT_STREQ(keypath2.ToString(false).c_str(), "[b4e3f5ed/0'/44']xprv9xcgxExFiq8qWLdxFHXpEZF8VH7Qr9YDZb8c7vMsqygWk2YGTBgSnDtm1LESskfAJqGMWkWWGagNCSbHdVgA8EFxSbfAQTKSD1z4iJ8qHtq");
}